

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t header_pax_extensions
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  archive_string *as;
  wchar_t wVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  uint uVar5;
  size_t sVar6;
  int64_t iVar7;
  byte *pbVar8;
  dev_t dVar9;
  long lVar10;
  archive_string_conv *sc;
  archive_string *paVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  char *fmt;
  byte *pbVar15;
  archive_string *paVar16;
  byte *pbVar17;
  byte *pbVar18;
  size_t sVar19;
  byte *pbVar20;
  ulong uVar21;
  byte bVar22;
  bool bVar23;
  wchar_t local_b4;
  long local_88;
  long local_78;
  int64_t s;
  byte *local_68;
  byte *local_60;
  archive_string *local_58;
  int64_t *local_50;
  archive_string *local_48;
  byte *local_40;
  archive_string *local_38;
  
  wVar1 = read_body_to_string(a,(tar *)&tar->pax_header,(archive_string *)h,unconsumed,unconsumed);
  if (wVar1 != L'\0') {
    return wVar1;
  }
  wVar1 = tar_read_header(a,tar,entry,unconsumed);
  if ((wVar1 != L'\0') && (wVar1 != L'\xffffffec')) {
    return wVar1;
  }
  pbVar17 = (byte *)(tar->pax_header).s;
  uVar13 = (tar->pax_header).length;
  tar->pax_hdrcharset_binary = 0;
  paVar11 = &tar->entry_gname;
  (tar->entry_gname).length = 0;
  as = &tar->entry_linkpath;
  (tar->entry_linkpath).length = 0;
  (tar->entry_pathname).length = 0;
  local_38 = &tar->entry_pathname_override;
  (tar->entry_pathname_override).length = 0;
  local_48 = &tar->entry_uname;
  (tar->entry_uname).length = 0;
  local_50 = &tar->sparse_offset;
  local_b4 = L'\0';
  paVar16 = &tar->entry_pathname;
LAB_0014ed94:
  if (uVar13 == 0) goto LAB_0014fd20;
  uVar21 = 0;
  uVar12 = uVar13;
  pbVar8 = pbVar17;
  while( true ) {
    bVar23 = uVar12 == 0;
    uVar12 = uVar12 - 1;
    pbVar15 = pbVar17 + uVar13;
    if ((bVar23) || (bVar22 = *pbVar8, pbVar15 = pbVar8 + 1, bVar22 == 0x20)) break;
    if ((byte)(bVar22 - 0x3a) < 0xf6) {
      fmt = "Ignoring malformed pax extended attributes";
      goto LAB_0014fcea;
    }
    uVar21 = (ulong)(byte)(bVar22 - 0x30) + uVar21 * 10;
    pbVar8 = pbVar8 + 1;
    if (999999 < uVar21) {
      fmt = "Rejecting pax extended attribute > 1MB";
      goto LAB_0014fcea;
    }
  }
  uVar12 = uVar21 - 1;
  if ((uVar13 <= uVar12) || (pbVar17[uVar12] != 10)) {
    fmt = "Ignoring malformed pax extended attribute";
LAB_0014fcea:
    archive_set_error(&a->archive,-1,fmt);
    local_b4 = L'\xffffffec';
    goto LAB_0014fcf4;
  }
  pbVar17[uVar12] = 0;
  bVar22 = *pbVar15;
  if (bVar22 == 0x3d) {
    local_b4 = L'\xffffffff';
    goto LAB_0014fcf4;
  }
  pbVar18 = pbVar17 + (uVar21 - (long)pbVar15) + -2;
  pbVar8 = pbVar15;
  while( true ) {
    pbVar20 = pbVar8 + 1;
    if (bVar22 == 0) {
      fmt = "Invalid pax extended attributes";
      goto LAB_0014fcea;
    }
    if (bVar22 == 0x3d) break;
    bVar22 = *pbVar20;
    pbVar18 = pbVar18 + -1;
    pbVar8 = pbVar20;
  }
  *pbVar8 = 0;
  bVar22 = *pbVar15;
  wVar3 = L'\0';
  switch(bVar22) {
  case 0x61:
    local_58 = paVar16;
    iVar2 = strcmp((char *)pbVar15,"atime");
    if (iVar2 == 0) {
      pax_time((char *)pbVar20,&s,&local_78);
      archive_entry_set_atime(entry,s,local_78);
    }
    break;
  case 0x62:
  case 100:
  case 0x65:
  case 0x66:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x71:
  case 0x72:
  case 0x74:
switchD_0014ee87_caseD_62:
    local_58 = paVar16;
    goto LAB_0014f83c;
  case 99:
    local_58 = paVar16;
    iVar2 = strcmp((char *)pbVar15,"ctime");
    if (iVar2 == 0) {
      pax_time((char *)pbVar20,&s,&local_78);
      archive_entry_set_ctime(entry,s,local_78);
    }
    break;
  case 0x67:
    local_58 = paVar16;
    iVar2 = strcmp((char *)pbVar15,"gid");
    if (iVar2 == 0) {
      sVar6 = strlen((char *)pbVar20);
      iVar7 = tar_atol10((char *)pbVar20,sVar6);
      archive_entry_set_gid(entry,iVar7);
    }
    else {
      iVar2 = strcmp((char *)pbVar15,"gname");
      if (iVar2 == 0) {
        (tar->entry_gname).length = 0;
        sVar6 = strlen((char *)pbVar20);
        archive_strncat(paVar11,pbVar20,sVar6);
      }
    }
    break;
  case 0x68:
    local_58 = paVar16;
    iVar2 = strcmp((char *)pbVar15,"hdrcharset");
    if (iVar2 == 0) {
      iVar2 = strcmp((char *)pbVar20,"BINARY");
      if (iVar2 == 0) {
        tar->pax_hdrcharset_binary = 1;
      }
      else {
        iVar2 = strcmp((char *)pbVar20,"ISO-IR 10646 2000 UTF-8");
        if (iVar2 == 0) {
          tar->pax_hdrcharset_binary = 0;
        }
      }
    }
    break;
  case 0x6c:
    local_58 = paVar16;
    iVar2 = strcmp((char *)pbVar15,"linkpath");
    if (iVar2 == 0) {
      (tar->entry_linkpath).length = 0;
      sVar6 = strlen((char *)pbVar20);
      archive_strncat(as,pbVar20,sVar6);
    }
    break;
  case 0x6d:
    local_58 = paVar16;
    iVar2 = strcmp((char *)pbVar15,"mtime");
    if (iVar2 == 0) {
      pax_time((char *)pbVar20,&s,&local_78);
      archive_entry_set_mtime(entry,s,local_78);
    }
    break;
  case 0x70:
    local_58 = paVar16;
    iVar2 = strcmp((char *)pbVar15,"path");
    if (iVar2 == 0) {
      (tar->entry_pathname).length = 0;
      sVar19 = strlen((char *)pbVar20);
      paVar16 = local_58;
LAB_0014f3b5:
      archive_strncat(paVar16,pbVar20,sVar19);
    }
    break;
  case 0x73:
    local_58 = paVar16;
    iVar2 = strcmp((char *)pbVar15,"size");
    if (iVar2 == 0) {
      sVar6 = strlen((char *)pbVar20);
      iVar7 = tar_atol10((char *)pbVar20,sVar6);
      tar->entry_bytes_remaining = iVar7;
      if (tar->realsize_override == 0) {
        archive_entry_set_size(entry,iVar7);
        tar->realsize = tar->entry_bytes_remaining;
      }
    }
    break;
  case 0x75:
    local_58 = paVar16;
    iVar2 = strcmp((char *)pbVar15,"uid");
    if (iVar2 == 0) {
      sVar6 = strlen((char *)pbVar20);
      iVar7 = tar_atol10((char *)pbVar20,sVar6);
      archive_entry_set_uid(entry,iVar7);
    }
    else {
      iVar2 = strcmp((char *)pbVar15,"uname");
      if (iVar2 == 0) {
        (tar->entry_uname).length = 0;
        sVar19 = strlen((char *)pbVar20);
        paVar16 = local_48;
        goto LAB_0014f3b5;
      }
    }
    break;
  default:
    if (bVar22 == 0x53) {
      local_58 = paVar16;
      iVar2 = strcmp((char *)pbVar15,"SCHILY.acl.access");
      if (iVar2 == 0) {
        wVar3 = L'Ā';
      }
      else {
        iVar2 = strcmp((char *)pbVar15,"SCHILY.acl.default");
        if (iVar2 == 0) {
          wVar3 = L'Ȁ';
        }
        else {
          iVar2 = strcmp((char *)pbVar15,"SCHILY.acl.ace");
          if (iVar2 != 0) {
            iVar2 = strcmp((char *)pbVar15,"SCHILY.devmajor");
            if (iVar2 == 0) {
              sVar6 = strlen((char *)pbVar20);
              dVar9 = tar_atol10((char *)pbVar20,sVar6);
              archive_entry_set_rdevmajor(entry,dVar9);
            }
            else {
              iVar2 = strcmp((char *)pbVar15,"SCHILY.devminor");
              if (iVar2 == 0) {
                sVar6 = strlen((char *)pbVar20);
                dVar9 = tar_atol10((char *)pbVar20,sVar6);
                archive_entry_set_rdevminor(entry,dVar9);
              }
              else {
                iVar2 = strcmp((char *)pbVar15,"SCHILY.fflags");
                if (iVar2 == 0) {
                  archive_entry_copy_fflags_text(entry,(char *)pbVar20);
                }
                else {
                  iVar2 = strcmp((char *)pbVar15,"SCHILY.dev");
                  if (iVar2 == 0) {
                    sVar6 = strlen((char *)pbVar20);
                    dVar9 = tar_atol10((char *)pbVar20,sVar6);
                    archive_entry_set_dev(entry,dVar9);
                  }
                  else {
                    iVar2 = strcmp((char *)pbVar15,"SCHILY.ino");
                    if (iVar2 == 0) {
                      sVar6 = strlen((char *)pbVar20);
                      iVar7 = tar_atol10((char *)pbVar20,sVar6);
                      archive_entry_set_ino(entry,iVar7);
                    }
                    else {
                      iVar2 = strcmp((char *)pbVar15,"SCHILY.nlink");
                      if (iVar2 == 0) {
                        sVar6 = strlen((char *)pbVar20);
                        iVar7 = tar_atol10((char *)pbVar20,sVar6);
                        archive_entry_set_nlink(entry,(uint)iVar7);
                      }
                      else {
                        iVar2 = strcmp((char *)pbVar15,"SCHILY.realsize");
                        if (iVar2 == 0) {
                          sVar6 = strlen((char *)pbVar20);
                          iVar7 = tar_atol10((char *)pbVar20,sVar6);
                          tar->realsize = iVar7;
                          tar->realsize_override = 1;
                          archive_entry_set_size(entry,iVar7);
                        }
                        else {
                          iVar2 = strncmp((char *)pbVar15,"SCHILY.xattr.",0xd);
                          if (iVar2 == 0) {
                            sVar6 = strlen((char *)pbVar15);
                            if ((0xd < sVar6) &&
                               (iVar2 = bcmp(pbVar15,"SCHILY.xattr.",0xd), iVar2 == 0)) {
                              pbVar15 = pbVar15 + 0xd;
                              goto LAB_0014f62a;
                            }
                          }
                          else {
                            iVar2 = strcmp((char *)pbVar15,"SUN.holesdata");
                            if (iVar2 == 0) {
                              if (*pbVar20 != 0x20) {
LAB_0014fca2:
                                archive_set_error(&a->archive,-1,"Parse error: SUN.holesdata");
LAB_0014fb0f:
                                wVar3 = L'\xffffffec';
                                goto LAB_0014f83c;
                              }
                              local_88 = 0;
                              local_68 = (byte *)CONCAT44(local_68._4_4_,1);
                              do {
                                pbVar20 = pbVar20 + 1;
                                for (sVar19 = 0; bVar22 = pbVar20[sVar19], (bVar22 & 0xdf) != 0;
                                    sVar19 = sVar19 + 1) {
                                  if ((byte)(bVar22 - 0x3a) < 0xf6) goto LAB_0014fca2;
                                }
                                iVar7 = tar_atol10((char *)pbVar20,sVar19);
                                if (iVar7 < 0) goto LAB_0014fca2;
                                pbVar20 = pbVar20 + sVar19;
                                if (iVar7 - local_88 != 0 && local_88 <= iVar7) {
                                  wVar3 = gnu_add_sparse_entry(a,tar,local_88,iVar7 - local_88);
                                  if (wVar3 != L'\0') goto LAB_0014febd;
                                  tar->sparse_last->hole = (int)local_68;
                                  bVar22 = *pbVar20;
                                }
                                local_68 = (byte *)((ulong)local_68 ^ 1);
                                local_88 = iVar7;
                              } while (bVar22 != 0);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            break;
          }
          wVar3 = L'㰀';
        }
      }
      wVar4 = pax_attribute_acl(a,tar,entry,(char *)pbVar20,wVar3);
      wVar3 = L'\0';
      if (wVar4 != L'\xffffffe2') goto LAB_0014f83c;
      goto LAB_0014febd;
    }
    if (bVar22 == 0x4c) {
      local_58 = paVar16;
      iVar2 = strcmp((char *)pbVar15,"LIBARCHIVE.creationtime");
      if (iVar2 == 0) {
        pax_time((char *)pbVar20,&s,&local_78);
        archive_entry_set_birthtime(entry,s,local_78);
      }
      iVar2 = strcmp((char *)pbVar15,"LIBARCHIVE.symlinktype");
      if (iVar2 == 0) {
        iVar2 = strcmp((char *)pbVar20,"file");
        wVar3 = L'\x01';
        if (iVar2 != 0) {
          iVar2 = strcmp((char *)pbVar20,"dir");
          wVar3 = L'\x02';
          if (iVar2 != 0) goto LAB_0014f6d0;
        }
        archive_entry_set_symlink_type(entry,wVar3);
      }
LAB_0014f6d0:
      iVar2 = bcmp(pbVar15,"LIBARCHIVE.xattr.",0x11);
      if (((iVar2 == 0) && (sVar6 = strlen((char *)pbVar15), 0x11 < sVar6)) &&
         (iVar2 = bcmp(pbVar15,"LIBARCHIVE.xattr.",0x11), iVar2 == 0)) {
        pbVar15 = pbVar15 + 0x11;
        sVar6 = strlen((char *)pbVar15);
        pbVar8 = (byte *)malloc(sVar6 + 1);
        pbVar18 = pbVar8;
        if (pbVar8 != (byte *)0x0) {
          do {
            local_40 = pbVar18;
            bVar22 = *pbVar15;
            if (bVar22 == 0x25) {
              if ((pbVar15[1] == 0) || (pbVar15[2] == 0)) goto LAB_0014f7af;
              local_60 = (byte *)CONCAT44(local_60._4_4_,(int)(char)pbVar15[2]);
              local_68 = pbVar8;
              wVar3 = tohex((int)(char)pbVar15[1]);
              wVar4 = tohex((wchar_t)local_60);
              pbVar8 = local_68;
              if ((wVar3 | wVar4) < 0) goto LAB_0014f7af;
              pbVar15 = pbVar15 + 3;
              bVar22 = (byte)(wVar3 << 4) | (byte)wVar4;
            }
            else {
              if (bVar22 == 0) goto LAB_0014fa09;
LAB_0014f7af:
              pbVar15 = pbVar15 + 1;
            }
            *pbVar8 = bVar22;
            pbVar8 = pbVar8 + 1;
            pbVar18 = local_40;
          } while( true );
        }
      }
    }
    else {
      if (bVar22 == 0x52) {
        local_58 = paVar16;
        iVar2 = strcmp((char *)pbVar15,"RHT.security.selinux");
        if (iVar2 == 0) {
          pbVar15 = (byte *)0x230824;
LAB_0014f62a:
          archive_entry_xattr_add_entry(entry,(char *)pbVar15,pbVar20,(size_t)pbVar18);
        }
        break;
      }
      if (bVar22 != 0x47) goto switchD_0014ee87_caseD_62;
      local_58 = paVar16;
      iVar2 = strncmp((char *)pbVar15,"GNU.sparse",10);
      if ((iVar2 == 0) && (tar->sparse_allowed == 0)) {
        archive_set_error(&a->archive,-1,"Non-regular file cannot be sparse");
        goto LAB_0014febd;
      }
      iVar2 = strcmp((char *)pbVar15,"GNU.sparse.numblocks");
      if (iVar2 == 0) {
        *(undefined4 *)local_50 = 0xffffffff;
        *(undefined4 *)((long)local_50 + 4) = 0xffffffff;
        *(undefined4 *)(local_50 + 1) = 0xffffffff;
        *(undefined4 *)((long)local_50 + 0xc) = 0xffffffff;
        tar->sparse_gnu_major = 0;
        tar->sparse_gnu_minor = 0;
      }
      iVar2 = strcmp((char *)pbVar15,"GNU.sparse.offset");
      if (iVar2 == 0) {
        sVar6 = strlen((char *)pbVar20);
        iVar7 = tar_atol10((char *)pbVar20,sVar6);
        tar->sparse_offset = iVar7;
        if (tar->sparse_numbytes != -1) {
          wVar3 = gnu_add_sparse_entry(a,tar,iVar7,tar->sparse_numbytes);
          if (wVar3 != L'\0') goto LAB_0014febd;
          *(undefined4 *)local_50 = 0xffffffff;
          *(undefined4 *)((long)local_50 + 4) = 0xffffffff;
          *(undefined4 *)(local_50 + 1) = 0xffffffff;
          *(undefined4 *)((long)local_50 + 0xc) = 0xffffffff;
        }
      }
      iVar2 = strcmp((char *)pbVar15,"GNU.sparse.numbytes");
      if (iVar2 == 0) {
        sVar6 = strlen((char *)pbVar20);
        iVar7 = tar_atol10((char *)pbVar20,sVar6);
        tar->sparse_numbytes = iVar7;
        if (tar->sparse_offset != -1) {
          wVar3 = gnu_add_sparse_entry(a,tar,tar->sparse_offset,iVar7);
          if (wVar3 != L'\0') goto LAB_0014febd;
          *(undefined4 *)local_50 = 0xffffffff;
          *(undefined4 *)((long)local_50 + 4) = 0xffffffff;
          *(undefined4 *)(local_50 + 1) = 0xffffffff;
          *(undefined4 *)((long)local_50 + 0xc) = 0xffffffff;
        }
      }
      iVar2 = strcmp((char *)pbVar15,"GNU.sparse.size");
      if (iVar2 == 0) {
        sVar6 = strlen((char *)pbVar20);
        iVar7 = tar_atol10((char *)pbVar20,sVar6);
        tar->realsize = iVar7;
        archive_entry_set_size(entry,iVar7);
        tar->realsize_override = 1;
      }
      iVar2 = strcmp((char *)pbVar15,"GNU.sparse.map");
      if (iVar2 == 0) {
        tar->sparse_gnu_major = 0;
        tar->sparse_gnu_minor = 1;
        pbVar8 = (byte *)0xffffffffffffffff;
        pbVar18 = pbVar20;
        do {
          for (sVar19 = 0; (bVar22 = pbVar18[sVar19], bVar22 != 0 && (bVar22 != 0x2c));
              sVar19 = sVar19 + 1) {
            if ((byte)(bVar22 - 0x3a) < 0xf6) {
              wVar3 = L'\xffffffec';
              goto LAB_0014f83c;
            }
          }
          local_68 = pbVar8;
          local_60 = pbVar18;
          pbVar8 = (byte *)tar_atol10((char *)pbVar18,sVar19);
          if ((long)local_68 < 0) {
            if ((long)pbVar8 < 0) goto LAB_0014fb0f;
          }
          else {
            if (((long)pbVar8 < 0) ||
               (wVar3 = gnu_add_sparse_entry(a,tar,(int64_t)local_68,(int64_t)pbVar8),
               wVar3 != L'\0')) goto LAB_0014fb0f;
            bVar22 = local_60[sVar19];
            pbVar8 = (byte *)0xffffffffffffffff;
          }
          pbVar18 = local_60 + sVar19 + 1;
        } while (bVar22 != 0);
      }
      iVar2 = strcmp((char *)pbVar15,"GNU.sparse.major");
      if (iVar2 == 0) {
        sVar6 = strlen((char *)pbVar20);
        iVar7 = tar_atol10((char *)pbVar20,sVar6);
        tar->sparse_gnu_major = (int)iVar7;
        tar->sparse_gnu_pending = '\x01';
      }
      iVar2 = strcmp((char *)pbVar15,"GNU.sparse.minor");
      if (iVar2 == 0) {
        sVar6 = strlen((char *)pbVar20);
        iVar7 = tar_atol10((char *)pbVar20,sVar6);
        tar->sparse_gnu_minor = (int)iVar7;
        tar->sparse_gnu_pending = '\x01';
      }
      iVar2 = strcmp((char *)pbVar15,"GNU.sparse.name");
      if (iVar2 == 0) {
        (tar->entry_pathname_override).length = 0;
        sVar6 = strlen((char *)pbVar20);
        archive_strncat(local_38,pbVar20,sVar6);
      }
      iVar2 = strcmp((char *)pbVar15,"GNU.sparse.realsize");
      if (iVar2 == 0) {
        sVar6 = strlen((char *)pbVar20);
        iVar7 = tar_atol10((char *)pbVar20,sVar6);
        tar->realsize = iVar7;
        archive_entry_set_size(entry,iVar7);
        tar->realsize_override = 1;
      }
    }
  }
LAB_0014f830:
  wVar3 = L'\0';
LAB_0014f83c:
  pbVar17 = pbVar17 + uVar21;
  if (wVar3 <= local_b4) {
    local_b4 = wVar3;
  }
  uVar13 = uVar13 - uVar21;
  paVar16 = local_58;
  goto LAB_0014ed94;
LAB_0014fa09:
  *pbVar8 = 0;
  sVar6 = strlen((char *)pbVar20);
  if (base64_decode_decode_table[0x42] != '\x01') {
    base64_decode_decode_table._112_4_ = 0xffffffff;
    base64_decode_decode_table._116_4_ = 0xffffffff;
    base64_decode_decode_table._120_4_ = 0xffffffff;
    base64_decode_decode_table._124_4_ = 0xffffffff;
    base64_decode_decode_table._96_4_ = 0xffffffff;
    base64_decode_decode_table._100_4_ = 0xffffffff;
    base64_decode_decode_table._104_4_ = 0xffffffff;
    base64_decode_decode_table._108_4_ = 0xffffffff;
    base64_decode_decode_table._80_4_ = 0xffffffff;
    base64_decode_decode_table._84_4_ = 0xffffffff;
    base64_decode_decode_table._88_4_ = 0xffffffff;
    base64_decode_decode_table._92_4_ = 0xffffffff;
    base64_decode_decode_table._64_4_ = 0xffffffff;
    base64_decode_decode_table._68_4_ = 0xffffffff;
    base64_decode_decode_table._72_4_ = 0xffffffff;
    base64_decode_decode_table._76_4_ = 0xffffffff;
    base64_decode_decode_table._48_4_ = 0xffffffff;
    base64_decode_decode_table._52_4_ = 0xffffffff;
    base64_decode_decode_table._56_4_ = 0xffffffff;
    base64_decode_decode_table._60_4_ = 0xffffffff;
    base64_decode_decode_table._32_4_ = 0xffffffff;
    base64_decode_decode_table._36_4_ = 0xffffffff;
    base64_decode_decode_table._40_4_ = 0xffffffff;
    base64_decode_decode_table._44_4_ = 0xffffffff;
    base64_decode_decode_table._16_4_ = 0xffffffff;
    base64_decode_decode_table._20_4_ = 0xffffffff;
    base64_decode_decode_table._24_4_ = 0xffffffff;
    base64_decode_decode_table._28_4_ = 0xffffffff;
    base64_decode_decode_table._0_4_ = 0xffffffff;
    base64_decode_decode_table._4_4_ = 0xffffffff;
    base64_decode_decode_table._8_4_ = 0xffffffff;
    base64_decode_decode_table._12_4_ = 0xffffffff;
    for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 1) {
      base64_decode_decode_table[(byte)(&base64_decode_digits)[lVar10]] = (char)lVar10;
    }
  }
  pbVar18 = (byte *)malloc((sVar6 - (sVar6 >> 2)) + 1);
  pbVar8 = local_40;
  pbVar15 = pbVar18;
  if (pbVar18 != (byte *)0x0) {
    while (sVar6 != 0) {
      uVar14 = 0;
      uVar5 = 0;
      while( true ) {
        if ((3 < uVar5) || (sVar6 == 0)) goto LAB_0014fabe;
        bVar22 = *pbVar20;
        if ((bVar22 == 0x3d) || (bVar22 == 0x5f)) break;
        if (((char)bVar22 < ' ') || ((byte)base64_decode_decode_table[bVar22] == 0xff)) {
          pbVar20 = pbVar20 + 1;
          sVar6 = sVar6 - 1;
        }
        else {
          pbVar20 = pbVar20 + 1;
          uVar14 = uVar14 << 6 | (uint)(byte)base64_decode_decode_table[bVar22];
          sVar6 = sVar6 - 1;
          uVar5 = uVar5 + 1;
        }
      }
      sVar6 = 0;
LAB_0014fabe:
      iVar2 = uVar14 << (('\x04' - (char)uVar5) * '\x06' & 0x1fU);
      if (uVar5 == 2) {
LAB_0014fae2:
        *pbVar15 = (byte)((uint)iVar2 >> 0x10);
      }
      else {
        if (uVar5 == 3) {
LAB_0014fadf:
          pbVar15[1] = (byte)((uint)iVar2 >> 8);
          goto LAB_0014fae2;
        }
        if (uVar5 == 4) {
          pbVar15[2] = (byte)iVar2;
          goto LAB_0014fadf;
        }
      }
      pbVar15 = pbVar15 + (uVar5 * 3 >> 2);
    }
    archive_entry_xattr_add_entry(entry,(char *)local_40,pbVar18,(long)pbVar15 - (long)pbVar18);
    free(pbVar8);
    pbVar8 = pbVar18;
  }
  free(pbVar8);
  goto LAB_0014f830;
LAB_0014fd20:
  if (tar->pax_hdrcharset_binary == 0) {
    local_58 = paVar16;
    sc = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    if (sc != (archive_string_conv *)0x0) {
      if (tar->compat_2x != 0) {
        archive_string_conversion_set_opt(sc,L'\x01');
      }
      goto LAB_0014fd8f;
    }
  }
  else {
    sc = tar->opt_sconv;
    local_58 = paVar16;
LAB_0014fd8f:
    sVar19 = (tar->entry_gname).length;
    if ((sVar19 != 0) &&
       (wVar3 = _archive_entry_copy_gname_l(entry,paVar11->s,sVar19,sc), wVar3 != L'\0')) {
      local_b4 = set_conversion_failed_error(a,sc,"Gname");
      if (local_b4 == L'\xffffffe2') goto LAB_0014febd;
      archive_entry_copy_gname(entry,paVar11->s);
    }
    sVar19 = (tar->entry_linkpath).length;
    if ((sVar19 != 0) && (wVar3 = _archive_entry_copy_link_l(entry,as->s,sVar19,sc), wVar3 != L'\0')
       ) {
      local_b4 = set_conversion_failed_error(a,sc,"Linkname");
      if (local_b4 == L'\xffffffe2') goto LAB_0014febd;
      archive_entry_copy_link(entry,as->s);
    }
    paVar11 = local_38;
    if ((((tar->entry_pathname_override).length != 0) ||
        (paVar11 = local_58, (tar->entry_pathname).length != 0)) &&
       (wVar3 = _archive_entry_copy_pathname_l(entry,paVar11->s,paVar11->length,sc), wVar3 != L'\0')
       ) {
      local_b4 = set_conversion_failed_error(a,sc,"Pathname");
      if (local_b4 == L'\xffffffe2') goto LAB_0014febd;
      archive_entry_copy_pathname(entry,paVar11->s);
    }
    sVar19 = (tar->entry_uname).length;
    if ((sVar19 == 0) ||
       (wVar3 = _archive_entry_copy_uname_l(entry,local_48->s,sVar19,sc), wVar3 == L'\0'))
    goto LAB_0014fcf4;
    local_b4 = set_conversion_failed_error(a,sc,"Uname");
    if (local_b4 != L'\xffffffe2') {
      archive_entry_copy_uname(entry,local_48->s);
      goto LAB_0014fcf4;
    }
  }
LAB_0014febd:
  local_b4 = L'\xffffffe2';
LAB_0014fcf4:
  if (wVar1 < local_b4) {
    local_b4 = wVar1;
  }
  tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
  return local_b4;
}

Assistant:

static int
header_pax_extensions(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err, err2;

	err = read_body_to_string(a, tar, &(tar->pax_header), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);

	/* Parse the next header. */
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);

	/*
	 * TODO: Parse global/default options into 'entry' struct here
	 * before handling file-specific options.
	 *
	 * This design (parse standard header, then overwrite with pax
	 * extended attribute data) usually works well, but isn't ideal;
	 * it would be better to parse the pax extended attributes first
	 * and then skip any fields in the standard header that were
	 * defined in the pax header.
	 */
	err2 = pax_header(a, tar, entry, &tar->pax_header);
	err =  err_combine(err, err2);
	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}